

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O1

void csp_ps(uint16_t node,uint32_t timeout)

{
  uint uVar1;
  csp_conn_t *conn;
  csp_packet_t *pcVar2;
  
  conn = csp_connect('\x02',node,'\x02',0,0x40);
  if (conn != (csp_conn_t *)0x0) {
    pcVar2 = csp_buffer_get(0);
    if (pcVar2 != (csp_packet_t *)0x0) {
      (pcVar2->field_5).data[0] = 'U';
      pcVar2->length = 1;
      csp_send(conn,pcVar2);
      pcVar2 = csp_read(conn,timeout);
      while (pcVar2 != (csp_packet_t *)0x0) {
        uVar1 = (uint)pcVar2->length;
        if (0xfe < pcVar2->length) {
          uVar1 = 0xff;
        }
        pcVar2->header[(ulong)uVar1 + 8] = '\0';
        csp_print_func("%s",&pcVar2->field_5);
        csp_buffer_free(pcVar2);
        pcVar2 = csp_read(conn,timeout);
      }
      csp_print_func("\r\n");
    }
    csp_buffer_free((void *)0x0);
    csp_close(conn);
    return;
  }
  return;
}

Assistant:

void csp_ps(uint16_t node, uint32_t timeout) {

	/* Open connection */
	csp_conn_t * conn = csp_connect(CSP_PRIO_NORM, node, CSP_PS, 0, CSP_O_CRC32);
	if (conn == NULL) {
		return;
	}

	/* Prepare data */
	csp_packet_t * packet = csp_buffer_get(0);

	/* Check malloc */
	if (packet == NULL) {
		goto out;
	}

	packet->data[0] = 0x55;
	packet->length = 1;

	/* Try to send frame */
	csp_send(conn, packet);

	while (1) {

		/* Read incoming frame */
		packet = csp_read(conn, timeout);
		if (packet == NULL) {
			break;
		}

		/* We have a reply, ensure data is 0 (zero) termianted */
		const unsigned int length = (packet->length < sizeof(packet->data)) ? packet->length : (sizeof(packet->data) - 1);
		packet->data[length] = 0;
		csp_print("%s", packet->data);

		/* Each packet from csp_read must to be freed by user */
		csp_buffer_free(packet);
	}

	csp_print("\r\n");

	/* Clean up */
out:
	csp_buffer_free(packet);
	csp_close(conn);
}